

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

DynamicProfileInfo *
Js::DynamicProfileInfo::Deserialize<Js::BufferReader>
          (BufferReader *reader,Recycler *recycler,LocalFunctionId *functionId)

{
  Type *pTVar1;
  Type *addr;
  Type *addr_00;
  Type *addr_01;
  Type *addr_02;
  Type *addr_03;
  Type *pTVar2;
  Type *addr_04;
  code *pcVar3;
  unsigned_short uVar4;
  bool bVar5;
  BOOL BVar6;
  BVIndex BVar7;
  Recycler *pRVar8;
  undefined4 *puVar9;
  ValueType *data_00;
  LdLenInfo *data_01;
  LdElemInfo *data_02;
  StElemInfo *data_03;
  DynamicProfileFunctionInfo *pDVar10;
  DynamicProfileInfo *this;
  ulong uVar11;
  LdLenInfo *this_00;
  Type *addr_05;
  undefined1 local_e8 [8];
  TrackAllocData data;
  FldInfo *local_b8;
  ValueType *local_b0;
  CallSiteInfo *local_a8;
  CallSiteInfo *local_a0;
  ValueType *local_98;
  ValueType *local_90;
  ValueType *local_88;
  ImplicitCallFlags *local_80;
  Bits local_75;
  BVFixed *pBStack_70;
  Bits bits;
  uint local_68;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_64;
  Type local_62;
  uint32 recursiveInlineInfo;
  ThisInfo thisInfo;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  uint fldInfoCount;
  uint loopCount;
  ImplicitCallFlags implicitCallFlags;
  unsigned_short local_46;
  unsigned_short local_44;
  unsigned_short local_42;
  unsigned_short local_40;
  ArgSlot paramInfoCount;
  ProfileId ldLenInfoCount;
  ProfileId ldElemInfoCount;
  ProfileId stElemInfoCount;
  ProfileId arrayCallSiteCount;
  ProfileId slotInfoCount;
  ProfileId callSiteInfoCount;
  ProfileId callApplyTargetInfoCount;
  ProfileId returnTypeInfoCount;
  ProfileId divCount;
  ProfileId switchCount;
  
  local_46 = 0;
  local_44 = 0;
  local_42 = 0;
  local_40 = 0;
  paramInfoCount = 0;
  ldLenInfoCount = 0;
  ldElemInfoCount = 0;
  stElemInfoCount = 0;
  arrayCallSiteCount = 0;
  slotInfoCount = 0;
  callSiteInfoCount = 0;
  thisInfo.valueType.field_0 = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
  thisInfo.thisType = ThisType_Unknown;
  thisInfo._3_1_ = 0;
  __autoNestedHandledExceptionType.savedData.handledExceptionType = (Data)ExceptionType_None;
  _loopCount = recycler;
  ValueType::ValueType((ValueType *)&local_64.field_0);
  local_62 = ThisType_Unknown;
  local_68 = 0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&recursiveInlineInfo,ExceptionType_OutOfMemory);
  bVar5 = BufferReader::Read<unsigned_int>(reader,functionId);
  if (bVar5) {
    bVar5 = BufferReader::Read<unsigned_short>(reader,&local_46);
    if (bVar5) {
      if ((ulong)local_46 == 0) {
        data_00 = (ValueType *)0x0;
LAB_009670c8:
        bVar5 = BufferReader::Read<unsigned_short>(reader,&local_44);
        if (bVar5) {
          if ((ulong)local_44 == 0) {
            data_01 = (LdLenInfo *)0x0;
          }
          else {
            local_e8 = (undefined1  [8])&LdLenInfo::typeinfo;
            data.typeinfo = (type_info *)0x0;
            data.count = (size_t)anon_var_dwarf_499211e;
            data.filename._0_4_ = 0x8e0;
            data.plusSize = (ulong)local_44;
            pRVar8 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_e8);
            uVar4 = local_44;
            uVar11 = (ulong)local_44;
            if (uVar11 == 0) {
              data_01 = (LdLenInfo *)&DAT_00000008;
              Memory::Recycler::ClearTrackAllocInfo(pRVar8,(TrackAllocData *)0x0);
            }
            else {
              BVar6 = ExceptionCheck::CanHandleOutOfMemory();
              if (BVar6 == 0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar9 = 1;
                bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                            ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                            "ExceptionCheck::CanHandleOutOfMemory()");
                if (!bVar5) goto LAB_00967979;
                *puVar9 = 0;
              }
              data_01 = (LdLenInfo *)
                        Memory::Recycler::
                        AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                                  (pRVar8,(ulong)((uint)uVar4 * 4));
              if (data_01 == (LdLenInfo *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar9 = 1;
                bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                            ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
                if (!bVar5) goto LAB_00967979;
                *puVar9 = 0;
              }
              this_00 = data_01;
              do {
                ValueType::ValueType(&this_00->arrayType);
                (this_00->field_1).bits = '\0';
                this_00 = this_00 + 1;
              } while (this_00 != data_01 + uVar11);
            }
            bVar5 = BufferReader::ReadArray<Js::LdLenInfo>(reader,data_01,(ulong)local_44);
            if (!bVar5) goto LAB_00967909;
          }
          bVar5 = BufferReader::Read<unsigned_short>(reader,&local_42);
          if (bVar5) {
            if ((ulong)local_42 == 0) {
              data_02 = (LdElemInfo *)0x0;
            }
            else {
              local_e8 = (undefined1  [8])&LdElemInfo::typeinfo;
              data.typeinfo = (type_info *)0x0;
              data.count = (size_t)anon_var_dwarf_499211e;
              data.filename._0_4_ = 0x8ee;
              data.plusSize = (ulong)local_42;
              pRVar8 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_e8);
              data_02 = Memory::AllocateArray<Memory::Recycler,Js::LdElemInfo,false>
                                  ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                   (ulong)local_42);
              bVar5 = BufferReader::ReadArray<Js::LdElemInfo>(reader,data_02,(ulong)local_42);
              if (!bVar5) goto LAB_00967909;
            }
            bVar5 = BufferReader::Read<unsigned_short>(reader,&local_40);
            if (bVar5) {
              if ((ulong)local_40 == 0) {
                data_03 = (StElemInfo *)0x0;
              }
              else {
                local_e8 = (undefined1  [8])&StElemInfo::typeinfo;
                data.typeinfo = (type_info *)0x0;
                data.count = (size_t)anon_var_dwarf_499211e;
                data.filename._0_4_ = 0x8fc;
                data.plusSize = (ulong)local_40;
                pRVar8 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_e8);
                data_03 = Memory::AllocateArray<Memory::Recycler,Js::StElemInfo,false>
                                    ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                     (ulong)local_40);
                bVar5 = BufferReader::ReadArray<Js::StElemInfo>(reader,data_03,(ulong)local_40);
                if (!bVar5) goto LAB_00967909;
              }
              bVar5 = BufferReader::Read<unsigned_short>(reader,&paramInfoCount);
              if (bVar5) {
                if ((ulong)paramInfoCount == 0) {
                  data.line = 0;
                  data._36_4_ = 0;
                }
                else {
                  local_e8 = (undefined1  [8])&ArrayCallSiteInfo::typeinfo;
                  data.typeinfo = (type_info *)0x0;
                  data.count = (size_t)anon_var_dwarf_499211e;
                  data.filename._0_4_ = 0x90a;
                  data.plusSize = (ulong)paramInfoCount;
                  pRVar8 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_e8);
                  data._32_8_ = Memory::AllocateArray<Memory::Recycler,Js::ArrayCallSiteInfo,false>
                                          ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeaf,
                                           0,(ulong)paramInfoCount);
                  bVar5 = BufferReader::ReadArray<Js::ArrayCallSiteInfo>
                                    (reader,(ArrayCallSiteInfo *)data._32_8_,(ulong)paramInfoCount);
                  if (!bVar5) goto LAB_00967909;
                }
                bVar5 = BufferReader::Read<unsigned_int>(reader,(uint *)&thisInfo);
                if (bVar5) {
                  if ((ulong)(uint)thisInfo == 0) {
                    local_b8 = (FldInfo *)0x0;
                  }
                  else {
                    local_e8 = (undefined1  [8])&FldInfo::typeinfo;
                    data.typeinfo = (type_info *)0x0;
                    data.count = (size_t)anon_var_dwarf_499211e;
                    data.filename._0_4_ = 0x918;
                    data.plusSize = (ulong)(uint)thisInfo;
                    pRVar8 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_e8)
                    ;
                    local_b8 = Memory::AllocateArray<Memory::Recycler,Js::FldInfo,false>
                                         ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeaf,0
                                          ,(ulong)(uint)thisInfo);
                    bVar5 = BufferReader::ReadArray<Js::FldInfo>
                                      (reader,local_b8,(ulong)(uint)thisInfo);
                    if (!bVar5) goto LAB_00967909;
                  }
                  bVar5 = BufferReader::Read<unsigned_short>(reader,&ldLenInfoCount);
                  if (bVar5) {
                    if ((ulong)ldLenInfoCount == 0) {
                      local_b0 = (ValueType *)0x0;
                    }
                    else {
                      local_e8 = (undefined1  [8])&ValueType::typeinfo;
                      data.typeinfo = (type_info *)0x0;
                      data.count = (size_t)anon_var_dwarf_499211e;
                      data.filename._0_4_ = 0x926;
                      data.plusSize = (ulong)ldLenInfoCount;
                      pRVar8 = Memory::Recycler::TrackAllocInfo
                                         (_loopCount,(TrackAllocData *)local_e8);
                      local_b0 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                           ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeaf
                                            ,0,(ulong)ldLenInfoCount);
                      bVar5 = BufferReader::ReadArray<ValueType>
                                        (reader,local_b0,(ulong)ldLenInfoCount);
                      if (!bVar5) goto LAB_00967909;
                    }
                    bVar5 = BufferReader::Read<unsigned_short>(reader,&ldElemInfoCount);
                    if (bVar5) {
                      if ((ulong)ldElemInfoCount == 0) {
                        local_a8 = (CallSiteInfo *)0x0;
                      }
                      else {
                        local_e8 = (undefined1  [8])&CallSiteInfo::typeinfo;
                        data.typeinfo = (type_info *)0x0;
                        data.count = (size_t)anon_var_dwarf_499211e;
                        data.filename._0_4_ = 0x937;
                        data.plusSize = (ulong)ldElemInfoCount;
                        pRVar8 = Memory::Recycler::TrackAllocInfo
                                           (_loopCount,(TrackAllocData *)local_e8);
                        local_a8 = Memory::AllocateArray<Memory::Recycler,Js::CallSiteInfo,false>
                                             ((Memory *)pRVar8,
                                              (Recycler *)Memory::Recycler::AllocLeaf,0,
                                              (ulong)ldElemInfoCount);
                        bVar5 = BufferReader::ReadArray<Js::CallSiteInfo>
                                          (reader,local_a8,(ulong)ldElemInfoCount);
                        if (!bVar5) goto LAB_00967909;
                      }
                      bVar5 = BufferReader::Read<unsigned_short>(reader,&stElemInfoCount);
                      if (bVar5) {
                        if ((ulong)stElemInfoCount == 0) {
                          local_a0 = (CallSiteInfo *)0x0;
                        }
                        else {
                          local_e8 = (undefined1  [8])&CallSiteInfo::typeinfo;
                          data.typeinfo = (type_info *)0x0;
                          data.count = (size_t)anon_var_dwarf_499211e;
                          data.filename._0_4_ = 0x948;
                          data.plusSize = (ulong)stElemInfoCount;
                          pRVar8 = Memory::Recycler::TrackAllocInfo
                                             (_loopCount,(TrackAllocData *)local_e8);
                          local_a0 = Memory::AllocateArray<Memory::Recycler,Js::CallSiteInfo,false>
                                               ((Memory *)pRVar8,
                                                (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                (ulong)stElemInfoCount);
                          bVar5 = BufferReader::ReadArray<Js::CallSiteInfo>
                                            (reader,local_a0,(ulong)stElemInfoCount);
                          if (!bVar5) goto LAB_00967909;
                        }
                        bVar5 = BufferReader::Read<unsigned_short>(reader,&slotInfoCount);
                        if (bVar5) {
                          if ((ulong)slotInfoCount == 0) {
                            local_98 = (ValueType *)0x0;
                          }
                          else {
                            local_e8 = (undefined1  [8])&ValueType::typeinfo;
                            data.typeinfo = (type_info *)0x0;
                            data.count = (size_t)anon_var_dwarf_499211e;
                            data.filename._0_4_ = 0x956;
                            data.plusSize = (ulong)slotInfoCount;
                            pRVar8 = Memory::Recycler::TrackAllocInfo
                                               (_loopCount,(TrackAllocData *)local_e8);
                            local_98 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                                 ((Memory *)pRVar8,
                                                  (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                  (ulong)slotInfoCount);
                            bVar5 = BufferReader::ReadArray<ValueType>
                                              (reader,local_98,(ulong)slotInfoCount);
                            if (!bVar5) goto LAB_00967909;
                          }
                          bVar5 = BufferReader::Read<unsigned_short>(reader,&callSiteInfoCount);
                          if (bVar5) {
                            if ((ulong)callSiteInfoCount == 0) {
                              local_90 = (ValueType *)0x0;
                            }
                            else {
                              local_e8 = (undefined1  [8])&ValueType::typeinfo;
                              data.typeinfo = (type_info *)0x0;
                              data.count = (size_t)anon_var_dwarf_499211e;
                              data.filename._0_4_ = 0x964;
                              data.plusSize = (ulong)callSiteInfoCount;
                              pRVar8 = Memory::Recycler::TrackAllocInfo
                                                 (_loopCount,(TrackAllocData *)local_e8);
                              local_90 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                                   ((Memory *)pRVar8,
                                                    (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                    (ulong)callSiteInfoCount);
                              bVar5 = BufferReader::ReadArray<ValueType>
                                                (reader,local_90,(ulong)callSiteInfoCount);
                              if (!bVar5) goto LAB_00967909;
                            }
                            bVar5 = BufferReader::Read<unsigned_short>(reader,&arrayCallSiteCount);
                            if (bVar5) {
                              if ((ulong)arrayCallSiteCount == 0) {
                                local_88 = (ValueType *)0x0;
                              }
                              else {
                                local_e8 = (undefined1  [8])&ValueType::typeinfo;
                                data.typeinfo = (type_info *)0x0;
                                data.count = (size_t)anon_var_dwarf_499211e;
                                data.filename._0_4_ = 0x972;
                                data.plusSize = (ulong)arrayCallSiteCount;
                                pRVar8 = Memory::Recycler::TrackAllocInfo
                                                   (_loopCount,(TrackAllocData *)local_e8);
                                local_88 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                                     ((Memory *)pRVar8,
                                                      (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                      (ulong)arrayCallSiteCount);
                                bVar5 = BufferReader::ReadArray<ValueType>
                                                  (reader,local_88,(ulong)arrayCallSiteCount);
                                if (!bVar5) goto LAB_00967909;
                              }
                              bVar5 = BufferReader::Read<unsigned_int>
                                                (reader,(uint *)&__autoNestedHandledExceptionType);
                              if (bVar5) {
                                if ((ulong)(uint)__autoNestedHandledExceptionType.savedData.
                                                 handledExceptionType == 0) {
                                  local_80 = (ImplicitCallFlags *)0x0;
                                }
                                else {
                                  local_e8 = (undefined1  [8])&ImplicitCallFlags::typeinfo;
                                  data.typeinfo = (type_info *)0x0;
                                  data.count = (size_t)anon_var_dwarf_499211e;
                                  data.filename._0_4_ = 0x980;
                                  data.plusSize =
                                       (ulong)(uint)__autoNestedHandledExceptionType.savedData.
                                                    handledExceptionType;
                                  pRVar8 = Memory::Recycler::TrackAllocInfo
                                                     (_loopCount,(TrackAllocData *)local_e8);
                                  local_80 = Memory::
                                             AllocateArray<Memory::Recycler,Js::ImplicitCallFlags,false>
                                                       ((Memory *)pRVar8,
                                                        (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                        (ulong)(uint)
                                                  __autoNestedHandledExceptionType.savedData.
                                                  handledExceptionType);
                                  bVar5 = BufferReader::ReadArray<Js::ImplicitCallFlags>
                                                    (reader,local_80,
                                                     (ulong)(uint)__autoNestedHandledExceptionType.
                                                                  savedData.handledExceptionType);
                                  if (!bVar5) goto LAB_00967909;
                                }
                                bVar5 = BufferReader::Read<Js::ImplicitCallFlags>
                                                  (reader,(ImplicitCallFlags *)
                                                          ((long)&fldInfoCount + 3));
                                if ((((bVar5) &&
                                     (bVar5 = BufferReader::Read<Js::ThisInfo>
                                                        (reader,(ThisInfo *)&local_64.field_0),
                                     bVar5)) &&
                                    (bVar5 = BufferReader::Read<Js::DynamicProfileInfo::Bits>
                                                       (reader,&local_75), bVar5)) &&
                                   (bVar5 = BufferReader::Read<unsigned_int>(reader,&local_68),
                                   bVar5)) {
                                  if (__autoNestedHandledExceptionType.savedData.
                                      handledExceptionType == ExceptionType_None) {
                                    pBStack_70 = (BVFixed *)0x0;
                                  }
                                  else {
                                    pBStack_70 = BVFixed::New<Memory::Recycler>
                                                           ((int)__autoNestedHandledExceptionType.
                                                                 savedData.handledExceptionType * 2,
                                                            _loopCount,false);
                                    BVar7 = BVFixed::WordCount(pBStack_70);
                                    bVar5 = BufferReader::ReadArray<BVUnitT<unsigned_long>>
                                                      (reader,(BVUnitT<unsigned_long> *)
                                                              (pBStack_70 + 1),(ulong)BVar7);
                                    if (!bVar5) goto LAB_00967909;
                                  }
                                  local_e8 = (undefined1  [8])&DynamicProfileFunctionInfo::typeinfo;
                                  data.typeinfo = (type_info *)0x0;
                                  data.plusSize = 0xffffffffffffffff;
                                  data.count = (size_t)anon_var_dwarf_499211e;
                                  data.filename._0_4_ = 0x998;
                                  pRVar8 = Memory::Recycler::TrackAllocInfo
                                                     (_loopCount,(TrackAllocData *)local_e8);
                                  pDVar10 = (DynamicProfileFunctionInfo *)
                                            new<Memory::Recycler>(0x20,pRVar8,0x776608);
                                  pDVar10->paramInfoCount = local_46;
                                  pDVar10->ldLenInfoCount = local_44;
                                  pDVar10->ldElemInfoCount = local_42;
                                  pDVar10->stElemInfoCount = local_40;
                                  pDVar10->arrayCallSiteCount = paramInfoCount;
                                  pDVar10->fldInfoCount = (Type)thisInfo;
                                  pDVar10->slotInfoCount = ldLenInfoCount;
                                  pDVar10->callSiteInfoCount = ldElemInfoCount;
                                  pDVar10->callApplyTargetInfoCount = stElemInfoCount;
                                  pDVar10->divCount = slotInfoCount;
                                  pDVar10->switchCount = callSiteInfoCount;
                                  pDVar10->returnTypeInfoCount = arrayCallSiteCount;
                                  pDVar10->loopCount =
                                       (Type)__autoNestedHandledExceptionType.savedData.
                                             handledExceptionType;
                                  local_e8 = (undefined1  [8])&typeinfo;
                                  data.typeinfo = (type_info *)0x0;
                                  data.plusSize = 0xffffffffffffffff;
                                  data.count = (size_t)anon_var_dwarf_499211e;
                                  data.filename._0_4_ = 0x9a7;
                                  pRVar8 = Memory::Recycler::TrackAllocInfo
                                                     (_loopCount,(TrackAllocData *)local_e8);
                                  this = (DynamicProfileInfo *)
                                         new<Memory::Recycler>(0xa8,pRVar8,0x387914);
                                  DynamicProfileInfo(this);
                                  Memory::Recycler::WBSetBit((char *)this);
                                  (this->dynamicProfileFunctionInfo).ptr = pDVar10;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
                                  pTVar1 = &this->parameterInfo;
                                  Memory::Recycler::WBSetBit((char *)pTVar1);
                                  pTVar1->ptr = data_00;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
                                  addr = &this->ldLenInfo;
                                  Memory::Recycler::WBSetBit((char *)addr);
                                  addr->ptr = data_01;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
                                  addr_00 = &this->ldElemInfo;
                                  Memory::Recycler::WBSetBit((char *)addr_00);
                                  addr_00->ptr = data_02;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
                                  addr_01 = &this->stElemInfo;
                                  Memory::Recycler::WBSetBit((char *)addr_01);
                                  addr_01->ptr = data_03;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
                                  addr_02 = &this->arrayCallSiteInfo;
                                  Memory::Recycler::WBSetBit((char *)addr_02);
                                  addr_02->ptr = (ArrayCallSiteInfo *)data._32_8_;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_02);
                                  addr_03 = &this->fldInfo;
                                  Memory::Recycler::WBSetBit((char *)addr_03);
                                  addr_03->ptr = local_b8;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_03);
                                  pTVar1 = &this->slotInfo;
                                  Memory::Recycler::WBSetBit((char *)pTVar1);
                                  pTVar1->ptr = local_b0;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
                                  pTVar2 = &this->callSiteInfo;
                                  Memory::Recycler::WBSetBit((char *)pTVar2);
                                  pTVar2->ptr = local_a8;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
                                  pTVar2 = &this->callApplyTargetInfo;
                                  Memory::Recycler::WBSetBit((char *)pTVar2);
                                  pTVar2->ptr = local_a0;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
                                  pTVar1 = &this->divideTypeInfo;
                                  Memory::Recycler::WBSetBit((char *)pTVar1);
                                  pTVar1->ptr = local_98;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
                                  pTVar1 = &this->switchTypeInfo;
                                  Memory::Recycler::WBSetBit((char *)pTVar1);
                                  pTVar1->ptr = local_90;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
                                  pTVar1 = &this->returnTypeInfo;
                                  Memory::Recycler::WBSetBit((char *)pTVar1);
                                  pTVar1->ptr = local_88;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
                                  addr_04 = &this->loopImplicitCallFlags;
                                  Memory::Recycler::WBSetBit((char *)addr_04);
                                  addr_04->ptr = local_80;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_04);
                                  this->implicitCallFlags = fldInfoCount._3_1_;
                                  addr_05 = &this->loopFlags;
                                  Memory::Recycler::WBSetBit((char *)addr_05);
                                  addr_05->ptr = pBStack_70;
                                  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_05);
                                  (this->thisInfo).thisType = local_62;
                                  (this->thisInfo).valueType.field_0 = local_64;
                                  *(undefined4 *)&this->bits = local_75._0_4_;
                                  (this->bits).field_0x4 = local_75._4_1_;
                                  this->m_recursiveInlineInfo = local_68;
                                  ResetAllPolymorphicCallSiteInfo(this);
                                  goto LAB_0096708e;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        local_e8 = (undefined1  [8])&ValueType::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.count = (size_t)anon_var_dwarf_499211e;
        data.filename._0_4_ = 0x8d2;
        data.plusSize = (ulong)local_46;
        pRVar8 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_e8);
        uVar4 = local_46;
        if (local_46 == 0) {
          data_00 = (ValueType *)&DAT_00000008;
          Memory::Recycler::ClearTrackAllocInfo(pRVar8,(TrackAllocData *)0x0);
        }
        else {
          BVar6 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar6 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar9 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                        "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar5) goto LAB_00967979;
            *puVar9 = 0;
          }
          data_00 = (ValueType *)
                    Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                              (pRVar8,(ulong)((uint)uVar4 * 2));
          if (data_00 == (ValueType *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar9 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar5) goto LAB_00967979;
            *puVar9 = 0;
          }
          uVar11 = 0;
          do {
            ValueType::ValueType((ValueType *)((long)&data_00->field_0 + uVar11));
            uVar11 = uVar11 + 2;
          } while ((uint)uVar4 * 2 != uVar11);
        }
        bVar5 = BufferReader::ReadArray<ValueType>(reader,data_00,(ulong)local_46);
        if (bVar5) goto LAB_009670c8;
      }
LAB_00967909:
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)&recursiveInlineInfo);
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x9c6,"(false)","false");
      if (bVar5) {
        *puVar9 = 0;
        return (DynamicProfileInfo *)0x0;
      }
      goto LAB_00967979;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x8cc,"(false)","false");
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x8c6,"(false)","false");
  }
  if (bVar5 != false) {
    *puVar9 = 0;
    this = (DynamicProfileInfo *)0x0;
LAB_0096708e:
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&recursiveInlineInfo);
    return this;
  }
LAB_00967979:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

DynamicProfileInfo * DynamicProfileInfo::Deserialize(T * reader, Recycler* recycler, Js::LocalFunctionId * functionId)
    {
        Js::ArgSlot paramInfoCount = 0;
        ProfileId ldLenInfoCount = 0;
        ProfileId ldElemInfoCount = 0;
        ProfileId stElemInfoCount = 0;
        ProfileId arrayCallSiteCount = 0;
        ProfileId slotInfoCount = 0;
        ProfileId callSiteInfoCount = 0;
        ProfileId callApplyTargetInfoCount = 0;
        ProfileId returnTypeInfoCount = 0;
        ProfileId divCount = 0;
        ProfileId switchCount = 0;
        uint fldInfoCount = 0;
        uint loopCount = 0;
        ValueType * paramInfo = nullptr;
        LdLenInfo * ldLenInfo = nullptr;
        LdElemInfo * ldElemInfo = nullptr;
        StElemInfo * stElemInfo = nullptr;
        ArrayCallSiteInfo * arrayCallSiteInfo = nullptr;
        FldInfo * fldInfo = nullptr;
        ValueType * slotInfo = nullptr;
        CallSiteInfo * callSiteInfo = nullptr;
        CallSiteInfo * callApplyTargetInfo = nullptr;
        ValueType * divTypeInfo = nullptr;
        ValueType * switchTypeInfo = nullptr;
        ValueType * returnTypeInfo = nullptr;
        ImplicitCallFlags * loopImplicitCallFlags = nullptr;
        BVFixed * loopFlags = nullptr;
        ImplicitCallFlags implicitCallFlags;
        ThisInfo thisInfo;
        Bits bits;
        uint32 recursiveInlineInfo = 0;

        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);

            if (!reader->Read(functionId))
            {
                AssertOrFailFast(false);
                return nullptr;
            }

            if (!reader->Read(&paramInfoCount))
            {
                AssertOrFailFast(false);
                return nullptr;
            }

            if (paramInfoCount != 0)
            {
                paramInfo = RecyclerNewArrayLeaf(recycler, ValueType, paramInfoCount);
                if (!reader->ReadArray(paramInfo, paramInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&ldLenInfoCount))
            {
                goto Error;
            }

            if (ldLenInfoCount != 0)
            {
                ldLenInfo = RecyclerNewArrayLeaf(recycler, LdLenInfo, ldLenInfoCount);
                if (!reader->ReadArray(ldLenInfo, ldLenInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&ldElemInfoCount))
            {
                goto Error;
            }

            if (ldElemInfoCount != 0)
            {
                ldElemInfo = RecyclerNewArrayLeaf(recycler, LdElemInfo, ldElemInfoCount);
                if (!reader->ReadArray(ldElemInfo, ldElemInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&stElemInfoCount))
            {
                goto Error;
            }

            if (stElemInfoCount != 0)
            {
                stElemInfo = RecyclerNewArrayLeaf(recycler, StElemInfo, stElemInfoCount);
                if (!reader->ReadArray(stElemInfo, stElemInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&arrayCallSiteCount))
            {
                goto Error;
            }

            if (arrayCallSiteCount != 0)
            {
                arrayCallSiteInfo = RecyclerNewArrayLeaf(recycler, ArrayCallSiteInfo, arrayCallSiteCount);
                if (!reader->ReadArray(arrayCallSiteInfo, arrayCallSiteCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&fldInfoCount))
            {
                goto Error;
            }

            if (fldInfoCount != 0)
            {
                fldInfo = RecyclerNewArrayLeaf(recycler, FldInfo, fldInfoCount);
                if (!reader->ReadArray(fldInfo, fldInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&slotInfoCount))
            {
                goto Error;
            }

            if (slotInfoCount != 0)
            {
                slotInfo = RecyclerNewArrayLeaf(recycler, ValueType, slotInfoCount);
                if (!reader->ReadArray(slotInfo, slotInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&callSiteInfoCount))
            {
                goto Error;
            }

            if (callSiteInfoCount != 0)
            {
                // CallSiteInfo contains pointer "polymorphicCallSiteInfo", but
                // we explicitly save that pointer in FunctionBody. Safe to
                // allocate CallSiteInfo[] as Leaf here.
                callSiteInfo = RecyclerNewArrayLeaf(recycler, CallSiteInfo, callSiteInfoCount);
                if (!reader->ReadArray(callSiteInfo, callSiteInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&callApplyTargetInfoCount))
            {
                goto Error;
            }

            if (callApplyTargetInfoCount != 0)
            {
                // CallSiteInfo contains pointer "polymorphicCallSiteInfo", but
                // we explicitly save that pointer in FunctionBody. Safe to
                // allocate CallSiteInfo[] as Leaf here.
                callApplyTargetInfo = RecyclerNewArrayLeaf(recycler, CallSiteInfo, callApplyTargetInfoCount);
                if (!reader->ReadArray(callApplyTargetInfo, callApplyTargetInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&divCount))
            {
                goto Error;
            }

            if (divCount != 0)
            {
                divTypeInfo = RecyclerNewArrayLeaf(recycler, ValueType, divCount);
                if (!reader->ReadArray(divTypeInfo, divCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&switchCount))
            {
                goto Error;
            }

            if (switchCount != 0)
            {
                switchTypeInfo = RecyclerNewArrayLeaf(recycler, ValueType, switchCount);
                if (!reader->ReadArray(switchTypeInfo, switchCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&returnTypeInfoCount))
            {
                goto Error;
            }

            if (returnTypeInfoCount != 0)
            {
                returnTypeInfo = RecyclerNewArrayLeaf(recycler, ValueType, returnTypeInfoCount);
                if (!reader->ReadArray(returnTypeInfo, returnTypeInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&loopCount))
            {
                goto Error;
            }

            if (loopCount != 0)
            {
                loopImplicitCallFlags = RecyclerNewArrayLeaf(recycler, ImplicitCallFlags, loopCount);
                if (!reader->ReadArray(loopImplicitCallFlags, loopCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&implicitCallFlags) ||
                !reader->Read(&thisInfo) ||
                !reader->Read(&bits) ||
                !reader->Read(&recursiveInlineInfo))
            {
                goto Error;
            }

            if (loopCount != 0)
            {
                loopFlags = BVFixed::New(loopCount * LoopFlags::COUNT, recycler);
                if (!reader->ReadArray(loopFlags->GetData(), loopFlags->WordCount()))
                {
                    goto Error;
                }
            }

            DynamicProfileFunctionInfo * dynamicProfileFunctionInfo = RecyclerNewStructLeaf(recycler, DynamicProfileFunctionInfo);
            dynamicProfileFunctionInfo->paramInfoCount = paramInfoCount;
            dynamicProfileFunctionInfo->ldLenInfoCount = ldLenInfoCount;
            dynamicProfileFunctionInfo->ldElemInfoCount = ldElemInfoCount;
            dynamicProfileFunctionInfo->stElemInfoCount = stElemInfoCount;
            dynamicProfileFunctionInfo->arrayCallSiteCount = arrayCallSiteCount;
            dynamicProfileFunctionInfo->fldInfoCount = fldInfoCount;
            dynamicProfileFunctionInfo->slotInfoCount = slotInfoCount;
            dynamicProfileFunctionInfo->callSiteInfoCount = callSiteInfoCount;
            dynamicProfileFunctionInfo->callApplyTargetInfoCount = callApplyTargetInfoCount;
            dynamicProfileFunctionInfo->divCount = divCount;
            dynamicProfileFunctionInfo->switchCount = switchCount;
            dynamicProfileFunctionInfo->returnTypeInfoCount = returnTypeInfoCount;
            dynamicProfileFunctionInfo->loopCount = loopCount;

            DynamicProfileInfo * dynamicProfileInfo = RecyclerNew(recycler, DynamicProfileInfo);
            dynamicProfileInfo->dynamicProfileFunctionInfo = dynamicProfileFunctionInfo;
            dynamicProfileInfo->parameterInfo = paramInfo;
            dynamicProfileInfo->ldLenInfo = ldLenInfo;
            dynamicProfileInfo->ldElemInfo = ldElemInfo;
            dynamicProfileInfo->stElemInfo = stElemInfo;
            dynamicProfileInfo->arrayCallSiteInfo = arrayCallSiteInfo;
            dynamicProfileInfo->fldInfo = fldInfo;
            dynamicProfileInfo->slotInfo = slotInfo;
            dynamicProfileInfo->callSiteInfo = callSiteInfo;
            dynamicProfileInfo->callApplyTargetInfo = callApplyTargetInfo;
            dynamicProfileInfo->divideTypeInfo = divTypeInfo;
            dynamicProfileInfo->switchTypeInfo = switchTypeInfo;
            dynamicProfileInfo->returnTypeInfo = returnTypeInfo;
            dynamicProfileInfo->loopImplicitCallFlags = loopImplicitCallFlags;
            dynamicProfileInfo->implicitCallFlags = implicitCallFlags;
            dynamicProfileInfo->loopFlags = loopFlags;
            dynamicProfileInfo->thisInfo = thisInfo;
            dynamicProfileInfo->bits = bits;
            dynamicProfileInfo->m_recursiveInlineInfo = recursiveInlineInfo;

            // Fixed functions and object type data is not serialized. There is no point in trying to serialize polymorphic call site info.
            dynamicProfileInfo->ResetAllPolymorphicCallSiteInfo();

            return dynamicProfileInfo;
        }
        catch (OutOfMemoryException)
        {
        }

    Error:
        AssertOrFailFast(false);
        return nullptr;
    }